

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t consume_optional_marker(archive_read *a,zip *zip)

{
  uint uVar1;
  uint32_t uVar2;
  zip_entry *pzVar3;
  wchar_t wVar4;
  uint32_t *puVar5;
  
  wVar4 = L'\0';
  if ((zip->end_of_entry != '\0') && (wVar4 = L'\0', (zip->entry->zip_flags & 8) != 0)) {
    puVar5 = (uint32_t *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    if (puVar5 == (uint32_t *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP end-of-file record");
      wVar4 = L'\xffffffe2';
    }
    else {
      if (((((char)*puVar5 == 'P') && (*(char *)((long)puVar5 + 1) == 'K')) &&
          (*(char *)((long)puVar5 + 2) == '\a')) && (*(char *)((long)puVar5 + 3) == '\b')) {
        puVar5 = puVar5 + 1;
        zip->unconsumed = 4;
      }
      pzVar3 = zip->entry;
      pzVar3->cm_zlib_z_crc32 = *puVar5;
      if ((pzVar3->flags & 1) == 0) {
        pzVar3->compressed_size = (ulong)puVar5[1];
        pzVar3->uncompressed_size = (ulong)puVar5[2];
        zip->unconsumed = zip->unconsumed + 0xc;
      }
      else {
        uVar1 = puVar5[4];
        if ((long)((ulong)(puVar5[2] | uVar1) << 0x20) < 0) {
          archive_set_error(&a->archive,0x54,"Overflow of 64-bit file sizes");
          return L'\xffffffe7';
        }
        uVar2 = puVar5[3];
        pzVar3->compressed_size = CONCAT44(puVar5[2],puVar5[1]);
        pzVar3->uncompressed_size = CONCAT44(uVar1,uVar2);
        zip->unconsumed = zip->unconsumed + 0x14;
      }
      wVar4 = L'\0';
    }
  }
  return wVar4;
}

Assistant:

static int
consume_optional_marker(struct archive_read *a, struct zip *zip)
{
	if (zip->end_of_entry && (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
		const char *p;

		if (NULL == (p = __archive_read_ahead(a, 24, NULL))) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP end-of-file record");
			return (ARCHIVE_FATAL);
		}
		/* Consume the optional PK\007\010 marker. */
		if (p[0] == 'P' && p[1] == 'K' &&
		    p[2] == '\007' && p[3] == '\010') {
			p += 4;
			zip->unconsumed = 4;
		}
		if (zip->entry->flags & LA_USED_ZIP64) {
			uint64_t compressed, uncompressed;
			zip->entry->crc32 = archive_le32dec(p);
			compressed = archive_le64dec(p + 4);
			uncompressed = archive_le64dec(p + 12);
			if (compressed > INT64_MAX ||
			    uncompressed > INT64_MAX) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Overflow of 64-bit file sizes");
				return ARCHIVE_FAILED;
			}
			zip->entry->compressed_size = compressed;
			zip->entry->uncompressed_size = uncompressed;
			zip->unconsumed += 20;
		} else {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le32dec(p + 4);
			zip->entry->uncompressed_size = archive_le32dec(p + 8);
			zip->unconsumed += 12;
		}
	}

    return (ARCHIVE_OK);
}